

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::
add_face_texcoords(ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
                  FaceHandle _fh,VertexHandle _vh,
                  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                  *_face_texcoords)

{
  BaseHandle BVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *in_RCX;
  long *in_RDI;
  uint i;
  HalfedgeHandle end_heh;
  HalfedgeHandle cur_heh;
  ArrayKernel *in_stack_ffffffffffffff98;
  BaseHandle _heh;
  undefined8 in_stack_ffffffffffffffa0;
  bool local_51;
  uint local_3c;
  BaseHandle local_2c;
  BaseHandle local_28;
  BaseHandle local_24 [2];
  BaseHandle local_1c;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *local_18;
  BaseHandle local_8 [2];
  
  local_18 = in_RCX;
  local_28.idx_ =
       (int)ArrayKernel::halfedge_handle
                      (in_stack_ffffffffffffff98,(BaseHandle)(int)in_stack_ffffffffffffffa0);
  local_1c.idx_ = local_28.idx_;
  local_24[0].idx_ =
       (int)ArrayKernel::prev_halfedge_handle
                      (in_stack_ffffffffffffff98,(BaseHandle)(int)in_stack_ffffffffffffffa0);
  while( true ) {
    local_2c.idx_ =
         (int)ArrayKernel::to_vertex_handle
                        (in_stack_ffffffffffffff98,(BaseHandle)(int)in_stack_ffffffffffffffa0);
    bVar2 = BaseHandle::operator!=(&local_2c,local_8);
    local_51 = false;
    if (bVar2) {
      local_51 = BaseHandle::operator!=(&local_1c,local_24);
    }
    if (local_51 == false) break;
    local_1c.idx_ =
         (int)ArrayKernel::next_halfedge_handle
                        (in_stack_ffffffffffffff98,(BaseHandle)(int)in_stack_ffffffffffffffa0);
  }
  local_3c = 0;
  while( true ) {
    uVar3 = (ulong)local_3c;
    sVar4 = std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
            ::size(local_18);
    BVar1.idx_ = local_1c.idx_;
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
             ::operator[](local_18,(ulong)local_3c);
    _heh.idx_ = (int)uVar3;
    (**(code **)(*in_RDI + 0xa8))(in_RDI,BVar1.idx_,pvVar5);
    local_1c.idx_ = (int)ArrayKernel::next_halfedge_handle(in_stack_ffffffffffffff98,_heh.idx_);
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

virtual void add_face_texcoords( FaceHandle _fh, VertexHandle _vh, const std::vector<Vec2f>& _face_texcoords) override
  {
    // get first halfedge handle
    HalfedgeHandle cur_heh   = mesh_.halfedge_handle(_fh);
    HalfedgeHandle end_heh   = mesh_.prev_halfedge_handle(cur_heh);

    // find start heh
    while( mesh_.to_vertex_handle(cur_heh) != _vh && cur_heh != end_heh )
      cur_heh = mesh_.next_halfedge_handle( cur_heh);

    for(unsigned int i=0; i<_face_texcoords.size(); ++i)
    {
      set_texcoord( cur_heh, _face_texcoords[i]);
      cur_heh = mesh_.next_halfedge_handle( cur_heh);
    }
  }